

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O1

FConsoleCommand *
ScanChainForName(FConsoleCommand *start,char *name,size_t namelen,FConsoleCommand **prev)

{
  char *__s1;
  int iVar1;
  
  *prev = (FConsoleCommand *)0x0;
  if (start != (FConsoleCommand *)0x0) {
    do {
      __s1 = start->m_Name;
      iVar1 = strncasecmp(__s1,name,namelen);
      if (0 < iVar1) {
        return (FConsoleCommand *)0x0;
      }
      if ((iVar1 == 0) && (__s1[namelen] == '\0')) {
        return start;
      }
      *prev = start;
      start = start->m_Next;
    } while (start != (FConsoleCommand *)0x0);
  }
  return (FConsoleCommand *)0x0;
}

Assistant:

static FConsoleCommand *ScanChainForName (FConsoleCommand *start, const char *name, size_t namelen, FConsoleCommand **prev)
{
	int comp;

	*prev = NULL;
	while (start)
	{
		comp = strnicmp (start->m_Name, name, namelen);
		if (comp > 0)
			return NULL;
		else if (comp == 0 && start->m_Name[namelen] == 0)
			return start;

		*prev = start;
		start = start->m_Next;
	}
	return NULL;
}